

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O0

uint8_t * dtl_json_reader_parse_value(dtl_json_reader_t *self,uint8_t *pBegin,uint8_t *pEnd)

{
  uint8_t uVar1;
  int iVar2;
  uint8_t *puVar3;
  long lVar4;
  dtl_dv_t *pdVar5;
  adt_str_t *str;
  int firstChar;
  uint8_t *pResult;
  uint8_t *pNext;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  dtl_json_reader_t *self_local;
  
  pResult = pBegin;
  if (pBegin < pEnd) {
    uVar1 = *pBegin;
    iVar2 = bstr_pred_is_digit(uVar1);
    if ((iVar2 == 0) && (uVar1 != '-')) {
      if (uVar1 == '\"') {
        lVar4 = adt_str_new();
        pResult = pBegin;
        if (lVar4 != 0) {
          puVar3 = (uint8_t *)bstr_parse_json_string_literal(&self->ctx,pBegin,pEnd,lVar4);
          pResult = pBegin;
          if (pBegin < puVar3) {
            pdVar5 = (dtl_dv_t *)dtl_sv_make_str(lVar4);
            self->data->currentElem = pdVar5;
            self->parseState = '\x04';
            pResult = puVar3;
          }
          adt_str_delete(lVar4);
        }
      }
      else if (uVar1 == '[') {
        pdVar5 = (dtl_dv_t *)dtl_av_new();
        self->data->currentElem = pdVar5;
        if (self->data->currentElem == (dtl_dv_t *)0x0) {
          self->parseState = '\x01';
          self->lastError = 1;
          pResult = pBegin;
        }
        else {
          self->parseState = '\x05';
          pResult = pBegin + 1;
        }
      }
      else if (uVar1 == 'f') {
        puVar3 = (uint8_t *)bstr_match_cstr(pBegin,pEnd,"false");
        pResult = pBegin;
        if (pBegin < puVar3) {
          pdVar5 = (dtl_dv_t *)dtl_sv_make_bool(0);
          self->data->currentElem = pdVar5;
          self->parseState = '\x04';
          pResult = puVar3;
        }
      }
      else if (uVar1 == 'n') {
        puVar3 = (uint8_t *)bstr_match_cstr(pBegin,pEnd,"null");
        pResult = pBegin;
        if (pBegin < puVar3) {
          self->data->currentElem = (dtl_dv_t *)&g_dtl_sv_none;
          self->parseState = '\x04';
          pResult = puVar3;
        }
      }
      else if (uVar1 == 't') {
        puVar3 = (uint8_t *)bstr_match_cstr(pBegin,pEnd,"true");
        pResult = pBegin;
        if (pBegin < puVar3) {
          pdVar5 = (dtl_dv_t *)dtl_sv_make_bool(1);
          self->data->currentElem = pdVar5;
          self->parseState = '\x04';
          pResult = puVar3;
        }
      }
      else if (uVar1 == '{') {
        pdVar5 = (dtl_dv_t *)dtl_hv_new();
        self->data->currentElem = pdVar5;
        if (self->data->currentElem == (dtl_dv_t *)0x0) {
          self->parseState = '\x01';
          self->lastError = 1;
          pResult = pBegin;
        }
        else {
          self->parseState = '\a';
          pResult = pBegin + 1;
        }
      }
      else {
        self->parseState = '\x01';
        self->lastError = 2;
        pResult = pBegin;
      }
    }
    else {
      puVar3 = dtl_json_reader_parse_number(self,pBegin,pEnd);
      pResult = pBegin;
      if (pBegin < puVar3) {
        self->parseState = '\x04';
        pResult = puVar3;
      }
    }
  }
  return pResult;
}

Assistant:

static const uint8_t *dtl_json_reader_parse_value(dtl_json_reader_t *self, const uint8_t *pBegin, const uint8_t *pEnd)
{
   const uint8_t *pNext = pBegin;
   if (pNext < pEnd)
   {
      const uint8_t *pResult = (const uint8_t*) 0;
      int firstChar = (int) *pBegin;
      if (bstr_pred_is_digit(firstChar) || firstChar == '-')
      {
         pResult = dtl_json_reader_parse_number(self, pNext, pEnd);
         if (pResult > pBegin)
         {
            pNext = pResult;
            self->parseState = PARSE_STATE_POST_VALUE;
         }
      }
      else
      {
         adt_str_t *str;

         switch(firstChar)
         {
         case '"':
            str = adt_str_new();
            if (str != 0)
            {
               pResult = bstr_parse_json_string_literal(&self->ctx, pNext, pEnd, str);
               if (pResult > pBegin)
               {
                  self->data->currentElem = (dtl_dv_t*) dtl_sv_make_str(str);
                  pNext = pResult;
                  self->parseState = PARSE_STATE_POST_VALUE;
               }
               adt_str_delete(str);
            }
            break;
         case '[':
            self->data->currentElem = (dtl_dv_t*) dtl_av_new();
            if (self->data->currentElem == 0)
            {
               self->parseState = PARSE_STATE_ERROR;
               self->lastError = DTL_JSON_MEM_ERROR;
            }
            else
            {
               self->parseState = PARSE_STATE_ARRAY_BEGIN;
               pNext++;
            }
            break;
         case '{':
            self->data->currentElem = (dtl_dv_t*) dtl_hv_new();
            if (self->data->currentElem == 0)
            {
               self->parseState = PARSE_STATE_ERROR;
               self->lastError = DTL_JSON_MEM_ERROR;
            }
            else
            {
               self->parseState = PARSE_STATE_OBJECT_BEGIN;
               pNext++;
            }
            break;
         case 'f':
            pResult = bstr_match_cstr(pNext, pEnd, "false");
            if (pResult > pBegin)
            {
               self->data->currentElem = (dtl_dv_t*) dtl_sv_make_bool(false);
               pNext = pResult;
               self->parseState = PARSE_STATE_POST_VALUE;
            }
            break;
         case 't':
            pResult = bstr_match_cstr(pNext, pEnd, "true");
            if (pResult > pBegin)
            {
               self->data->currentElem = (dtl_dv_t*) dtl_sv_make_bool(true);
               pNext = pResult;
               self->parseState = PARSE_STATE_POST_VALUE;
            }
            break;
         case 'n':
            pResult = bstr_match_cstr(pNext, pEnd, "null");
            if (pResult > pBegin)
            {
               self->data->currentElem = (dtl_dv_t*) dtl_sv_none();
               pNext = pResult;
               self->parseState = PARSE_STATE_POST_VALUE;
            }
            break;
         default:
            self->parseState = PARSE_STATE_ERROR;
            self->lastError = DTL_JSON_UNEXPECTED_CHAR_ERROR;
         }
      }
   }
   return pNext;
}